

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O2

int luaL_newmetatable(lua_State *L,char *tname)

{
  int iVar1;
  
  iVar1 = lua_getfield(L,-0xf4628,tname);
  if (iVar1 == 0) {
    lua_settop(L,-2);
    lua_createtable(L,0,2);
    lua_pushstring(L,tname);
    lua_setfield(L,-2,"__name");
    lua_pushvalue(L,-1);
    lua_setfield(L,-0xf4628,tname);
  }
  return (uint)(iVar1 == 0);
}

Assistant:

LUALIB_API int luaL_newmetatable (lua_State *L, const char *tname) {
  if (luaL_getmetatable(L, tname) != LUA_TNIL)  /* name already in use? */
    return 0;  /* leave previous value on top, but return 0 */
  lua_pop(L, 1);
  lua_createtable(L, 0, 2);  /* create metatable */
  lua_pushstring(L, tname);
  lua_setfield(L, -2, "__name");  /* metatable.__name = tname */
  lua_pushvalue(L, -1);
  lua_setfield(L, LUA_REGISTRYINDEX, tname);  /* registry.name = metatable */
  return 1;
}